

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cd03::XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper::RunImpl
          (XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char *local_38;
  char *expected;
  TestDetails details;
  XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper *this_local;
  
  details._24_8_ = this;
  UnitTest::TestDetails::TestDetails((TestDetails *)&expected,"A Test","suite","A File",0x10e1);
  UnitTest::DeferredTestReporter::ReportTestStart
            (&(this->super_XmlTestReporterFixture).reporter.super_DeferredTestReporter,
             (TestDetails *)&expected);
  UnitTest::DeferredTestReporter::ReportFailure
            (&(this->super_XmlTestReporterFixture).reporter.super_DeferredTestReporter,
             (TestDetails *)&expected,"A Failure");
  UnitTest::XmlTestReporter::ReportSummary(&(this->super_XmlTestReporterFixture).reporter,1,1,1,0.1)
  ;
  local_38 = 
  "<?xml version=\"1.0\"?><unittest-results tests=\"1\" failedtests=\"1\" failures=\"1\" time=\"0.1\"><test suite=\"suite\" name=\"A Test\" time=\"0\"><failure message=\"A File(4321) : A Failure\"/></test></unittest-results>"
  ;
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  std::__cxx11::ostringstream::str();
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_88,*ppTVar2,0x70);
  UnitTest::CheckEqual<char_const*,std::__cxx11::string>(results,&local_38,&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, SingleFailedTestReportSummaryFormat)
{
    TestDetails const details("A Test", "suite", "A File", 4321);

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, "A Failure");
    reporter.ReportSummary(1, 1, 1, 0.1f);

    const char *expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"1\" failedtests=\"1\" failures=\"1\" time=\"0.1\">"
        "<test suite=\"suite\" name=\"A Test\" time=\"0\">"
        "<failure message=\"A File(4321) : A Failure\"/>"
        "</test>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}